

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationSoftsign * __thiscall
CoreML::Specification::ActivationParams::mutable_softsign(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0x3c) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x3c;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationSoftsign::ActivationSoftsign((ActivationSoftsign *)this_00);
    (this->NonlinearityType_).softsign_ = (ActivationSoftsign *)this_00;
  }
  return (ActivationSoftsign *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationSoftsign* ActivationParams::mutable_softsign() {
  if (!has_softsign()) {
    clear_NonlinearityType();
    set_has_softsign();
    NonlinearityType_.softsign_ = new ::CoreML::Specification::ActivationSoftsign;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.softsign)
  return NonlinearityType_.softsign_;
}